

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Section::~Section(Section *this)

{
  pointer pcVar1;
  int iVar2;
  IContext *pIVar3;
  undefined4 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  if (this->m_sectionIncluded == true) {
    pIVar3 = getCurrentContext();
    iVar2 = (*pIVar3->_vptr_IContext[2])(pIVar3);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x20))
              ((long *)CONCAT44(extraout_var,iVar2),this,&this->m_assertions);
  }
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  paVar4 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Section() {
            if( m_sectionIncluded )
                getCurrentContext().getResultCapture().sectionEnded( m_name, m_assertions );
        }